

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

void __thiscall
spvutils::
HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
::setFromSignUnbiasedExponentAndNormalizedSignificand
          (HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
           *this,bool negative,int_type exponent,uint_type significand,bool round_denorm_up)

{
  FloatProxy<spvutils::Float16> FVar1;
  ushort local_1a;
  ushort local_16;
  short local_14;
  uint_type new_value;
  bool significand_is_zero;
  bool round_denorm_up_local;
  uint_type significand_local;
  int_type exponent_local;
  bool negative_local;
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  *this_local;
  
  local_16 = significand;
  local_14 = exponent;
  if (exponent < -0xe) {
    local_16 = (ushort)((int)(uint)(significand | 0x400) >> 1);
  }
  for (; local_14 < -0xf; local_14 = local_14 + 1) {
    local_16 = (ushort)((int)(uint)local_16 >> 1);
  }
  if ((((local_14 == -0xf) && (local_16 == 0)) && (exponent < -0xe || significand != 0)) &&
     (round_denorm_up)) {
    local_16 = 1;
  }
  local_1a = 0;
  if (negative) {
    local_1a = 0x8000;
  }
  if ((short)(local_14 + 0xf) < 0) {
    __assert_fail("exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/hex_float.h"
                  ,0x19b,
                  "void spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>>::setFromSignUnbiasedExponentAndNormalizedSignificand(bool, int_type, uint_type, bool) [T = spvutils::FloatProxy<spvutils::Float16>, Traits = spvutils::HexFloatTraits<FloatProxy<Float16>>]"
                 );
  }
  FVar1 = BitwiseCast<spvutils::FloatProxy<spvutils::Float16>,unsigned_short>
                    (local_1a | (local_14 + 0xf) * 0x400 & 0x7c00U | local_16 & 0x3ff);
  (this->value_).data_ = FVar1.data_;
  return;
}

Assistant:

void setFromSignUnbiasedExponentAndNormalizedSignificand(
      bool negative, int_type exponent, uint_type significand,
      bool round_denorm_up) {
    bool significand_is_zero = significand == 0;

    if (exponent <= min_exponent) {
      // If this was denormalized, then we have to shift the bit on, meaning
      // the significand is not zero.
      significand_is_zero = false;
      significand |= first_exponent_bit;
      significand = static_cast<uint_type>(significand >> 1);
    }

    while (exponent < min_exponent) {
      significand = static_cast<uint_type>(significand >> 1);
      ++exponent;
    }

    if (exponent == min_exponent) {
      if (significand == 0 && !significand_is_zero && round_denorm_up) {
        significand = static_cast<uint_type>(0x1);
      }
    }

    uint_type new_value = 0;
    if (negative) {
      new_value = static_cast<uint_type>(new_value | sign_mask);
    }
    exponent = static_cast<int_type>(exponent + exponent_bias);
    assert(exponent >= 0);

    // put it all together
    exponent = static_cast<uint_type>((exponent << exponent_left_shift) &
                                      exponent_mask);
    significand = static_cast<uint_type>(significand & fraction_encode_mask);
    new_value = static_cast<uint_type>(new_value | (exponent | significand));
    value_ = BitwiseCast<T>(new_value);
  }